

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O1

Gia_Man_t * Gia_ManFromAigChoices(Aig_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  void *pvVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  Gia_Obj_t *pGVar10;
  long lVar11;
  
  if (p->pEquivs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pEquivs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaAig.c"
                  ,0x8a,"Gia_Man_t *Gia_ManFromAigChoices(Aig_Man_t *)");
  }
  p_00 = Gia_ManStart(p->vObjs->nSize - p->nDeleted);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p_00->nConstrs = p->nConstrs;
  piVar8 = (int *)calloc((long)p->vObjs->nSize - (long)p->nDeleted,4);
  p_00->pSibls = piVar8;
  Aig_ManCleanData(p);
  (p->pConst1->field_5).iData = 1;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar11];
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_006c5907:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_006c5907;
      *(int *)((long)pvVar3 + 0x28) = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556
      ;
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCis;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      Gia_ManFromAigChoices_rec
                (p_00,p,(Aig_Obj_t *)
                        (*(ulong *)((long)pVVar9->pArray[lVar11] + 8) & 0xfffffffffffffffe));
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCos;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      uVar4 = *(ulong *)((long)pVVar9->pArray[lVar11] + 8);
      uVar1 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x28);
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,(uint)uVar4 & 1 ^ uVar1);
      lVar11 = lVar11 + 1;
      pVVar9 = p->vCos;
    } while (lVar11 < pVVar9->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFromAigChoices( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pEquivs != NULL );
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create room to store equivalences
    pNew->pSibls = ABC_CALLOC( int, Aig_ManObjNum(p) );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->iData = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Gia_ManAppendCi( pNew );
    // add logic for the POs
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManFromAigChoices_rec( pNew, p, Aig_ObjFanin0(pObj) );        
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    //assert( Gia_ManObjNum(pNew) == Aig_ManObjNum(p) );
    return pNew;
}